

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringNStd.cpp
# Opt level: O0

void testStringNStd(int iterations)

{
  bool bVar1;
  int iVar2;
  String *local_150;
  String local_128;
  String local_100;
  String local_d8;
  int local_b0;
  int i;
  String *local_a0;
  undefined1 local_98 [8];
  String blah [3];
  usize val;
  int iterations_local;
  
  srand(100);
  local_a0 = (String *)local_98;
  String::String<81ul>
            (local_a0,(char (*) [81])
                      "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678"
            );
  local_a0 = (String *)&blah[0]._data.ref;
  String::String<81ul>
            (local_a0,(char (*) [81])
                      "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688"
            );
  local_a0 = (String *)&blah[1]._data.ref;
  String::String<81ul>
            (local_a0,(char (*) [81])
                      "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
            );
  for (local_b0 = 0; local_b0 < iterations; local_b0 = local_b0 + 1) {
    String::String<81ul>
              (&local_d8,
               (char (*) [81])
               "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678");
    iVar2 = rand();
    bVar1 = String::operator==(&local_d8,(String *)&blah[(long)(iVar2 % 3) + -1]._data.ref);
    String::~String(&local_d8);
    if (bVar1) {
      String::String<81ul>
                (&local_128,
                 (char (*) [81])
                 "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678")
      ;
      iVar2 = rand();
      String::operator+(&local_100,&local_128,(String *)&blah[(long)(iVar2 % 3) + -1]._data.ref);
      String::length(&local_100);
      String::~String(&local_100);
      String::~String(&local_128);
    }
  }
  local_150 = (String *)&blah[2]._data.ref;
  do {
    local_150 = local_150 + -1;
    String::~String(local_150);
  } while (local_150 != (String *)local_98);
  return;
}

Assistant:

void testStringNStd(int iterations)
{
  srand(100);
  usize val = 0;
  String blah[] = {
    "12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678",
    "12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688 12345688",
    "12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698 12345698"
  };
  for (int i = 0; i < iterations; ++i)
  {
    if(String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") == blah[rand() % 3])
      val += (String("12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678 12345678") + blah[rand() % 3]).length();
  }
}